

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O0

void __thiscall QTableView::setSelection(QTableView *this,QRect *rect,SelectionFlags command)

{
  Span *this_00;
  QAbstractItemModel *pQVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  QTableViewPrivate *pQVar11;
  int *piVar12;
  reference ppSVar13;
  ulong uVar14;
  QItemSelectionModel *pQVar15;
  undefined4 in_EDX;
  long *in_RDI;
  long in_FS_OFFSET;
  int row_1;
  int visual_1;
  int column_1;
  int visual;
  int row;
  int vertical;
  int column;
  int horizontal;
  int r;
  int b;
  int l;
  int t;
  Span *span;
  Span *it;
  SpanList *__range3;
  bool intersectsSpan;
  bool expanded;
  int right;
  int left;
  int bottom;
  int top;
  bool horizontalMoved;
  bool verticalMoved;
  QTableViewPrivate *d;
  QItemSelectionRange range;
  QModelIndex bottomRight_1;
  QModelIndex topLeft_1;
  QModelIndex bottomRight;
  QModelIndex topLeft;
  QModelIndex index;
  iterator __end3;
  iterator __begin3;
  QItemSelection selection;
  QModelIndex br;
  QModelIndex tl;
  int in_stack_fffffffffffffbd8;
  int in_stack_fffffffffffffbdc;
  QTableViewPrivate *in_stack_fffffffffffffbe0;
  undefined4 in_stack_fffffffffffffbe8;
  undefined4 in_stack_fffffffffffffbec;
  QItemSelectionRange *in_stack_fffffffffffffbf0;
  QItemSelectionRange *this_01;
  undefined4 in_stack_fffffffffffffc08;
  undefined4 in_stack_fffffffffffffc0c;
  QTableViewPrivate *in_stack_fffffffffffffc48;
  int local_2d4;
  int local_2cc;
  int local_2c4;
  int local_2bc;
  int local_28c;
  int local_288;
  int local_284;
  int local_280;
  QPersistentModelIndex local_238 [3];
  undefined1 *local_220;
  undefined1 *local_218;
  undefined1 *local_210;
  QPersistentModelIndex local_208 [3];
  undefined1 *local_1f0;
  undefined1 *local_1e8;
  undefined1 *local_1e0;
  QPersistentModelIndex local_1c8 [3];
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  QPersistentModelIndex local_198 [3];
  undefined1 *local_180;
  undefined1 *local_178;
  undefined1 *local_170;
  QPersistentModelIndex local_158 [3];
  undefined1 *local_140;
  undefined1 *local_138;
  undefined1 *local_130;
  QPersistentModelIndex local_128 [3];
  undefined1 *local_110;
  undefined1 *local_108;
  QAbstractItemModel *local_100;
  QPersistentModelIndex local_f8 [3];
  undefined1 *local_e0;
  undefined1 *local_d8;
  QAbstractItemModel *local_d0;
  _Self local_c8;
  _Self local_c0;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  undefined1 *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  undefined1 local_68 [8];
  QModelIndex local_60;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  undefined1 local_30 [8];
  QModelIndex local_28;
  undefined4 local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c = in_EDX;
  pQVar11 = d_func((QTableView *)0x8ba3c8);
  local_28._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_28.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
  local_28.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  bVar3 = QWidget::isRightToLeft((QWidget *)0x8ba40a);
  if (bVar3) {
    local_34 = QRect::left((QRect *)0x8ba41d);
    local_38 = QRect::right((QRect *)0x8ba431);
    qMax<int>(&local_34,&local_38);
  }
  else {
    local_3c = QRect::left((QRect *)0x8ba465);
    local_40 = QRect::right((QRect *)0x8ba479);
    qMin<int>(&local_3c,&local_40);
  }
  local_44 = QRect::top((QRect *)0x8ba4b9);
  local_48 = QRect::bottom((QRect *)0x8ba4cd);
  qMin<int>(&local_44,&local_48);
  QPoint::QPoint((QPoint *)in_stack_fffffffffffffbe0,in_stack_fffffffffffffbdc,
                 in_stack_fffffffffffffbd8);
  (**(code **)(*in_RDI + 0x1f0))(&local_28,in_RDI,local_30);
  local_60._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_60.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
  local_60.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  bVar3 = QWidget::isRightToLeft((QWidget *)0x8ba55a);
  if (bVar3) {
    local_6c = QRect::left((QRect *)0x8ba56d);
    local_70 = QRect::right((QRect *)0x8ba581);
    qMin<int>(&local_6c,&local_70);
  }
  else {
    local_74 = QRect::left((QRect *)0x8ba5b5);
    local_78 = QRect::right((QRect *)0x8ba5c9);
    qMax<int>(&local_74,&local_78);
  }
  local_7c = QRect::top((QRect *)0x8ba609);
  local_80 = QRect::bottom((QRect *)0x8ba61d);
  qMax<int>(&local_7c,&local_80);
  QPoint::QPoint((QPoint *)in_stack_fffffffffffffbe0,in_stack_fffffffffffffbdc,
                 in_stack_fffffffffffffbd8);
  (**(code **)(*in_RDI + 0x1f0))(&local_60,in_RDI,local_68);
  bVar3 = ::QPointer::operator_cast_to_bool((QPointer<QItemSelectionModel> *)0x8ba684);
  if ((((bVar3) && (bVar3 = QModelIndex::isValid((QModelIndex *)in_stack_fffffffffffffbe0), bVar3))
      && (bVar3 = QModelIndex::isValid((QModelIndex *)in_stack_fffffffffffffbe0), bVar3)) &&
     ((bVar3 = QAbstractItemViewPrivate::isIndexEnabled
                         (&in_stack_fffffffffffffbe0->super_QAbstractItemViewPrivate,
                          (QModelIndex *)
                          CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8)), bVar3 &&
      (bVar3 = QAbstractItemViewPrivate::isIndexEnabled
                         (&in_stack_fffffffffffffbe0->super_QAbstractItemViewPrivate,
                          (QModelIndex *)
                          CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8)), bVar3))))
  {
    verticalHeader((QTableView *)in_stack_fffffffffffffbe0);
    bVar3 = QHeaderView::sectionsMoved((QHeaderView *)in_stack_fffffffffffffbe0);
    horizontalHeader((QTableView *)in_stack_fffffffffffffbe0);
    bVar4 = QHeaderView::sectionsMoved((QHeaderView *)in_stack_fffffffffffffbe0);
    local_98 = &DAT_aaaaaaaaaaaaaaaa;
    local_90 = &DAT_aaaaaaaaaaaaaaaa;
    local_88 = &DAT_aaaaaaaaaaaaaaaa;
    QItemSelection::QItemSelection((QItemSelection *)0x8ba75f);
    local_280 = QModelIndex::row(&local_28);
    local_284 = QModelIndex::row(&local_60);
    local_288 = QModelIndex::column(&local_28);
    local_28c = QModelIndex::column(&local_60);
    bVar5 = QTableViewPrivate::hasSpans((QTableViewPrivate *)0x8ba7bc);
    if (bVar5) {
      bVar5 = false;
      QModelIndex::row(&local_28);
      local_9c = QTableViewPrivate::visualRow(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbdc);
      QModelIndex::row(&local_60);
      local_a0 = QTableViewPrivate::visualRow(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbdc);
      piVar12 = qMin<int>(&local_9c,&local_a0);
      local_280 = *piVar12;
      QModelIndex::column(&local_28);
      local_a4 = QTableViewPrivate::visualColumn
                           (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbdc);
      QModelIndex::column(&local_60);
      local_a8 = QTableViewPrivate::visualColumn
                           (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbdc);
      piVar12 = qMin<int>(&local_a4,&local_a8);
      local_288 = *piVar12;
      QModelIndex::row(&local_28);
      local_ac = QTableViewPrivate::visualRow(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbdc);
      QModelIndex::row(&local_60);
      local_b0 = QTableViewPrivate::visualRow(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbdc);
      piVar12 = qMax<int>(&local_ac,&local_b0);
      local_284 = *piVar12;
      QModelIndex::column(&local_28);
      local_b4 = QTableViewPrivate::visualColumn
                           (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbdc);
      QModelIndex::column(&local_60);
      local_b8 = QTableViewPrivate::visualColumn
                           (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbdc);
      piVar12 = qMax<int>(&local_b4,&local_b8);
      local_28c = *piVar12;
      do {
        bVar2 = false;
        local_c0._M_node = (_List_node_base *)&DAT_aaaaaaaaaaaaaaaa;
        local_c0._M_node =
             (_List_node_base *)
             std::__cxx11::list<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>::
             begin((list<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_> *)
                   in_stack_fffffffffffffbe0);
        local_c8._M_node = (_List_node_base *)&DAT_aaaaaaaaaaaaaaaa;
        local_c8._M_node =
             (_List_node_base *)
             std::__cxx11::list<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>::
             end((list<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_> *)
                 in_stack_fffffffffffffbe0);
        while (bVar6 = std::operator!=(&local_c0,&local_c8), bVar6) {
          ppSVar13 = std::_List_iterator<QSpanCollection::Span_*>::operator*
                               ((_List_iterator<QSpanCollection::Span_*> *)0x8baa88);
          this_00 = *ppSVar13;
          QSpanCollection::Span::top(this_00);
          iVar8 = QTableViewPrivate::visualRow(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbdc);
          QSpanCollection::Span::left(this_00);
          iVar9 = QTableViewPrivate::visualColumn
                            (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbdc);
          QSpanCollection::Span::top(this_00);
          QSpanCollection::Span::height(this_00);
          QTableViewPrivate::rowSpanEndLogical
                    (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8);
          iVar10 = QTableViewPrivate::visualRow(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbdc)
          ;
          QSpanCollection::Span::left(this_00);
          QSpanCollection::Span::width(this_00);
          QTableViewPrivate::columnSpanEndLogical
                    (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8);
          iVar7 = QTableViewPrivate::visualColumn
                            (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbdc);
          if (((iVar8 <= local_284) && (iVar9 <= local_28c)) &&
             ((local_280 <= iVar10 && (local_288 <= iVar7)))) {
            bVar5 = true;
            if (iVar8 < local_280) {
              bVar2 = true;
              local_280 = iVar8;
            }
            if (iVar9 < local_288) {
              bVar2 = true;
              local_288 = iVar9;
            }
            if (local_284 < iVar10) {
              bVar2 = true;
              local_284 = iVar10;
            }
            if (local_28c < iVar7) {
              bVar2 = true;
              local_28c = iVar7;
            }
            if (bVar2) break;
          }
          std::_List_iterator<QSpanCollection::Span_*>::operator++(&local_c0);
        }
      } while (bVar2);
      if (bVar5) {
        if ((!bVar3) && (!bVar4)) {
          pQVar1 = (pQVar11->super_QAbstractItemViewPrivate).model;
          QPersistentModelIndex::operator_cast_to_QModelIndex(local_f8);
          (**(code **)(*(long *)pQVar1 + 0x60))(&local_e0,pQVar1,local_280,local_288,local_f8);
          local_28._0_8_ = local_e0;
          local_28.i = (quintptr)local_d8;
          local_28.m.ptr = local_d0;
          pQVar1 = (pQVar11->super_QAbstractItemViewPrivate).model;
          QPersistentModelIndex::operator_cast_to_QModelIndex(local_128);
          (**(code **)(*(long *)pQVar1 + 0x60))(&local_110,pQVar1,local_284,local_28c,local_128);
          local_60._0_8_ = local_110;
          local_60.i = (quintptr)local_108;
          local_60.m.ptr = local_100;
        }
      }
      else {
        local_280 = QModelIndex::row(&local_28);
        local_284 = QModelIndex::row(&local_60);
        local_288 = QModelIndex::column(&local_28);
        local_28c = QModelIndex::column(&local_60);
      }
    }
    else if ((bVar3) && (bVar4)) {
      QModelIndex::row(&local_28);
      local_280 = QTableViewPrivate::visualRow(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbdc);
      QModelIndex::row(&local_60);
      local_284 = QTableViewPrivate::visualRow(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbdc);
      QModelIndex::column(&local_28);
      local_288 = QTableViewPrivate::visualColumn
                            (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbdc);
      QModelIndex::column(&local_60);
      local_28c = QTableViewPrivate::visualColumn
                            (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbdc);
    }
    else if (bVar4) {
      local_280 = QModelIndex::row(&local_28);
      local_284 = QModelIndex::row(&local_60);
      QModelIndex::column(&local_28);
      local_288 = QTableViewPrivate::visualColumn
                            (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbdc);
      in_stack_fffffffffffffc48 = pQVar11;
      QModelIndex::column(&local_60);
      local_28c = QTableViewPrivate::visualColumn
                            (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbdc);
    }
    else if (bVar3) {
      QModelIndex::row(&local_28);
      local_280 = QTableViewPrivate::visualRow(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbdc);
      QModelIndex::row(&local_60);
      local_284 = QTableViewPrivate::visualRow(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbdc);
      local_288 = QModelIndex::column(&local_28);
      local_28c = QModelIndex::column(&local_60);
    }
    if ((bVar4) && (bVar3)) {
      QList<QItemSelectionRange>::reserve
                ((QList<QItemSelectionRange> *)
                 CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
                 (qsizetype)in_stack_fffffffffffffc48);
      for (local_2bc = local_288; local_2bc <= local_28c; local_2bc = local_2bc + 1) {
        iVar8 = QTableViewPrivate::logicalColumn
                          (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbdc);
        for (local_2c4 = local_280; local_2c4 <= local_284; local_2c4 = local_2c4 + 1) {
          iVar9 = QTableViewPrivate::logicalRow(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbdc)
          ;
          local_140 = &DAT_aaaaaaaaaaaaaaaa;
          local_138 = &DAT_aaaaaaaaaaaaaaaa;
          local_130 = &DAT_aaaaaaaaaaaaaaaa;
          pQVar1 = (pQVar11->super_QAbstractItemViewPrivate).model;
          QPersistentModelIndex::operator_cast_to_QModelIndex(local_158);
          (**(code **)(*(long *)pQVar1 + 0x60))(&local_140,pQVar1,iVar9,iVar8,local_158);
          QItemSelectionRange::QItemSelectionRange
                    ((QItemSelectionRange *)in_stack_fffffffffffffbe0,
                     (QModelIndex *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
          QList<QItemSelectionRange>::append
                    ((QList<QItemSelectionRange> *)in_stack_fffffffffffffbe0,
                     (rvalue_ref)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
          QItemSelectionRange::~QItemSelectionRange
                    ((QItemSelectionRange *)in_stack_fffffffffffffbe0);
        }
      }
    }
    else if (bVar4) {
      QList<QItemSelectionRange>::reserve
                ((QList<QItemSelectionRange> *)
                 CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
                 (qsizetype)in_stack_fffffffffffffc48);
      for (local_2cc = local_288; local_2cc <= local_28c; local_2cc = local_2cc + 1) {
        iVar10 = QTableViewPrivate::logicalColumn
                           (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbdc);
        local_180 = &DAT_aaaaaaaaaaaaaaaa;
        local_178 = &DAT_aaaaaaaaaaaaaaaa;
        local_170 = &DAT_aaaaaaaaaaaaaaaa;
        pQVar1 = (pQVar11->super_QAbstractItemViewPrivate).model;
        iVar8 = local_280;
        iVar9 = iVar10;
        QPersistentModelIndex::operator_cast_to_QModelIndex(local_198);
        (**(code **)(*(long *)pQVar1 + 0x60))(&local_180,pQVar1,iVar8,iVar9,local_198);
        local_1b0 = &DAT_aaaaaaaaaaaaaaaa;
        local_1a8 = &DAT_aaaaaaaaaaaaaaaa;
        local_1a0 = &DAT_aaaaaaaaaaaaaaaa;
        pQVar1 = (pQVar11->super_QAbstractItemViewPrivate).model;
        QPersistentModelIndex::operator_cast_to_QModelIndex(local_1c8);
        (**(code **)(*(long *)pQVar1 + 0x60))(&local_1b0,pQVar1,local_284,iVar10,local_1c8);
        QItemSelectionRange::QItemSelectionRange
                  (in_stack_fffffffffffffbf0,
                   (QModelIndex *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8),
                   (QModelIndex *)in_stack_fffffffffffffbe0);
        QList<QItemSelectionRange>::append
                  ((QList<QItemSelectionRange> *)in_stack_fffffffffffffbe0,
                   (rvalue_ref)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
        QItemSelectionRange::~QItemSelectionRange((QItemSelectionRange *)in_stack_fffffffffffffbe0);
      }
    }
    else if (bVar3) {
      QList<QItemSelectionRange>::reserve
                ((QList<QItemSelectionRange> *)
                 CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
                 (qsizetype)in_stack_fffffffffffffc48);
      for (local_2d4 = local_280; local_2d4 <= local_284; local_2d4 = local_2d4 + 1) {
        iVar10 = QTableViewPrivate::logicalRow(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbdc);
        local_1f0 = &DAT_aaaaaaaaaaaaaaaa;
        local_1e8 = &DAT_aaaaaaaaaaaaaaaa;
        local_1e0 = &DAT_aaaaaaaaaaaaaaaa;
        in_stack_fffffffffffffbe0 =
             (QTableViewPrivate *)(pQVar11->super_QAbstractItemViewPrivate).model;
        iVar8 = iVar10;
        iVar9 = local_288;
        QPersistentModelIndex::operator_cast_to_QModelIndex(local_208);
        (**(code **)(*(long *)&(in_stack_fffffffffffffbe0->super_QAbstractItemViewPrivate).
                               super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                               super_QWidgetPrivate + 0x60))
                  (&local_1f0,in_stack_fffffffffffffbe0,iVar8,iVar9,local_208);
        local_220 = &DAT_aaaaaaaaaaaaaaaa;
        local_218 = &DAT_aaaaaaaaaaaaaaaa;
        local_210 = &DAT_aaaaaaaaaaaaaaaa;
        this_01 = (QItemSelectionRange *)(pQVar11->super_QAbstractItemViewPrivate).model;
        QPersistentModelIndex::operator_cast_to_QModelIndex(local_238);
        (**(code **)((this_01->tl).d + 0x60))(&local_220,this_01,iVar10,local_28c,local_238);
        QItemSelectionRange::QItemSelectionRange
                  (this_01,(QModelIndex *)CONCAT44(iVar9,iVar8),
                   (QModelIndex *)in_stack_fffffffffffffbe0);
        QList<QItemSelectionRange>::append
                  ((QList<QItemSelectionRange> *)in_stack_fffffffffffffbe0,
                   (rvalue_ref)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
        QItemSelectionRange::~QItemSelectionRange((QItemSelectionRange *)in_stack_fffffffffffffbe0);
      }
    }
    else {
      QItemSelectionRange::QItemSelectionRange
                (in_stack_fffffffffffffbf0,
                 (QModelIndex *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8),
                 (QModelIndex *)in_stack_fffffffffffffbe0);
      uVar14 = QItemSelectionRange::isEmpty();
      if ((uVar14 & 1) == 0) {
        QList<QItemSelectionRange>::append
                  ((QList<QItemSelectionRange> *)in_stack_fffffffffffffbe0,
                   (parameter_type)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
      }
      QItemSelectionRange::~QItemSelectionRange((QItemSelectionRange *)in_stack_fffffffffffffbe0);
    }
    pQVar15 = QPointer<QItemSelectionModel>::operator->((QPointer<QItemSelectionModel> *)0x8bb726);
    (**(code **)(*(long *)pQVar15 + 0x70))(pQVar15,&local_98,local_c);
    QItemSelection::~QItemSelection((QItemSelection *)0x8bb759);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTableView::setSelection(const QRect &rect, QItemSelectionModel::SelectionFlags command)
{
    Q_D(QTableView);
    QModelIndex tl = indexAt(QPoint(isRightToLeft() ? qMax(rect.left(), rect.right())
                                    : qMin(rect.left(), rect.right()), qMin(rect.top(), rect.bottom())));
    QModelIndex br = indexAt(QPoint(isRightToLeft() ? qMin(rect.left(), rect.right()) :
                                    qMax(rect.left(), rect.right()), qMax(rect.top(), rect.bottom())));
    if (!d->selectionModel || !tl.isValid() || !br.isValid() || !d->isIndexEnabled(tl) || !d->isIndexEnabled(br))
        return;

    const bool verticalMoved = verticalHeader()->sectionsMoved();
    const bool horizontalMoved = horizontalHeader()->sectionsMoved();

    QItemSelection selection;
    int top = tl.row();
    int bottom = br.row();
    int left = tl.column();
    int right = br.column();

    if (d->hasSpans()) {
        bool expanded;
        // when the current selection does not intersect with any spans of merged cells,
        // the range of selected cells must be the same as if there were no merged cells
        bool intersectsSpan = false;
        top = qMin(d->visualRow(tl.row()), d->visualRow(br.row()));
        left = qMin(d->visualColumn(tl.column()), d->visualColumn(br.column()));
        bottom = qMax(d->visualRow(tl.row()), d->visualRow(br.row()));
        right = qMax(d->visualColumn(tl.column()), d->visualColumn(br.column()));
        do {
            expanded = false;
            for (QSpanCollection::Span *it : d->spans.spans) {
                const QSpanCollection::Span &span = *it;
                const int t = d->visualRow(span.top());
                const int l = d->visualColumn(span.left());
                const int b = d->visualRow(d->rowSpanEndLogical(span.top(), span.height()));
                const int r = d->visualColumn(d->columnSpanEndLogical(span.left(), span.width()));
                if ((t > bottom) || (l > right) || (top > b) || (left > r))
                    continue; // no intersect
                intersectsSpan = true;
                if (t < top) {
                    top = t;
                    expanded = true;
                }
                if (l < left) {
                    left = l;
                    expanded = true;
                }
                if (b > bottom) {
                    bottom = b;
                    expanded = true;
                }
                if (r > right) {
                    right = r;
                    expanded = true;
                }
                if (expanded)
                    break;
            }
        } while (expanded);
        if (!intersectsSpan) {
            top = tl.row();
            bottom = br.row();
            left = tl.column();
            right = br.column();
        } else if (!verticalMoved && !horizontalMoved) {
            // top/left/bottom/right are visual, update indexes
            tl = d->model->index(top, left, d->root);
            br = d->model->index(bottom, right, d->root);
        }
    } else if (verticalMoved && horizontalMoved) {
         top = d->visualRow(tl.row());
         bottom = d->visualRow(br.row());
         left = d->visualColumn(tl.column());
         right = d->visualColumn(br.column());
    } else if (horizontalMoved) {
        top = tl.row();
        bottom = br.row();
        left = d->visualColumn(tl.column());
        right = d->visualColumn(br.column());
    } else if (verticalMoved) {
        top = d->visualRow(tl.row());
        bottom = d->visualRow(br.row());
        left = tl.column();
        right = br.column();
    }

    if (horizontalMoved && verticalMoved) {
         selection.reserve((right - left + 1) * (bottom - top + 1));
         for (int horizontal = left; horizontal <= right; ++horizontal) {
             int column = d->logicalColumn(horizontal);
             for (int vertical = top; vertical <= bottom; ++vertical) {
                 int row = d->logicalRow(vertical);
                 QModelIndex index = d->model->index(row, column, d->root);
                 selection.append(QItemSelectionRange(index));
             }
         }
    } else if (horizontalMoved) {
        selection.reserve(right - left + 1);
        for (int visual = left; visual <= right; ++visual) {
            int column = d->logicalColumn(visual);
            QModelIndex topLeft = d->model->index(top, column, d->root);
            QModelIndex bottomRight = d->model->index(bottom, column, d->root);
            selection.append(QItemSelectionRange(topLeft, bottomRight));
        }
    } else if (verticalMoved) {
        selection.reserve(bottom - top + 1);
        for (int visual = top; visual <= bottom; ++visual) {
            int row = d->logicalRow(visual);
            QModelIndex topLeft = d->model->index(row, left, d->root);
            QModelIndex bottomRight = d->model->index(row, right, d->root);
            selection.append(QItemSelectionRange(topLeft, bottomRight));
        }
    } else { // nothing moved
        QItemSelectionRange range(tl, br);
        if (!range.isEmpty())
            selection.append(range);
    }

    d->selectionModel->select(selection, command);
}